

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestBadStuff::testBadFile(TestBadStuff *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  bool result;
  string error;
  ifstream in;
  ValidSchema schema;
  basic_cstring<const_char> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  iterator in_stack_fffffffffffffd50;
  const_string *in_stack_fffffffffffffd58;
  unit_test_log_t *in_stack_fffffffffffffd60;
  basic_cstring<const_char> local_268;
  byte local_251;
  string local_250 [48];
  istream local_220;
  ValidSchema local_18 [24];
  
  std::operator<<((ostream *)&std::cout,"TestBadFile\n");
  avro::ValidSchema::ValidSchema(local_18);
  std::ifstream::ifstream(&local_220,"agjoewejefkjs",_S_in);
  std::__cxx11::string::string(local_250);
  bVar1 = avro::compileJsonSchema(&local_220,local_18,local_250);
  local_251 = bVar1 & 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50
               ,(const_string *)
                CONCAT17(in_stack_fffffffffffffd4f,CONCAT16(bVar1,in_stack_fffffffffffffd48)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffd50,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    in_stack_fffffffffffffd4f = 0;
    in_stack_fffffffffffffd18 = "false";
    in_stack_fffffffffffffd10 = (basic_cstring<const_char> *)&stack0xfffffffffffffd4f;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&stack0xfffffffffffffd60,&stack0xfffffffffffffd50,0x274,1,2,&local_251,"result");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b6a0c);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"(intentional) error: ");
  poVar3 = std::operator<<(poVar3,local_250);
  std::operator<<(poVar3,'\n');
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(&local_220);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x2b6a84);
  return;
}

Assistant:

void testBadFile() 
    {
        std::cout << "TestBadFile\n";

        avro::ValidSchema schema;
        std::ifstream in("agjoewejefkjs");
        std::string error;
        bool result = avro::compileJsonSchema(in, schema, error);
        BOOST_CHECK_EQUAL(result, false);
        std::cout << "(intentional) error: " << error << '\n';
    }